

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoissonGenerator.h
# Opt level: O0

float PoissonGenerator::anon_unknown_9::radicalInverse_VdC(uint32_t bits)

{
  uint uVar1;
  uint32_t bits_local;
  
  uVar1 = bits << 0x10 | bits >> 0x10;
  uVar1 = ((uVar1 & 0xaaaaaaaa) >> 1) + (uVar1 & 0x55555555) * 2;
  uVar1 = ((uVar1 & 0xcccccccc) >> 2) + (uVar1 & 0x33333333) * 4;
  uVar1 = (uVar1 & 0xf0f0f0f) << 4 | (uVar1 & 0xf0f0f0f0) >> 4;
  return (float)((uVar1 & 0xff00ff) << 8 | (uVar1 & 0xff00ff00) >> 8) * 2.3283064e-10;
}

Assistant:

float radicalInverse_VdC(uint32_t bits) {
  bits = (bits << 16u) | (bits >> 16u);
  bits = ((bits & 0x55555555u) << 1u) | ((bits & 0xAAAAAAAAu) >> 1u);
  bits = ((bits & 0x33333333u) << 2u) | ((bits & 0xCCCCCCCCu) >> 2u);
  bits = ((bits & 0x0F0F0F0Fu) << 4u) | ((bits & 0xF0F0F0F0u) >> 4u);
  bits = ((bits & 0x00FF00FFu) << 8u) | ((bits & 0xFF00FF00u) >> 8u);
  return float(float(bits) * 2.3283064365386963e-10); // / 0x100000000
}